

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_from_text_w(archive_acl *acl,wchar_t *text,wchar_t want_type)

{
  wchar_t wVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t *pwVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  wchar_t wVar12;
  ulong uVar13;
  wchar_t wVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  ulong uVar19;
  wchar_t *pwVar20;
  wchar_t *pwVar21;
  undefined8 uVar22;
  wchar_t *pwVar23;
  uint uVar24;
  wchar_t wVar25;
  bool bVar26;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_f4;
  wchar_t *local_f0;
  wchar_t *local_e8;
  ulong local_e0;
  undefined8 local_d8;
  ulong local_d0;
  wchar_t local_c8;
  wchar_t local_c4;
  ulong local_c0;
  uint local_b8;
  uint local_b4;
  archive_acl *local_b0;
  ulong local_a8;
  long local_a0;
  wchar_t *local_98;
  long local_90;
  wchar_t *local_88 [5];
  long alStack_60 [6];
  
  local_b8 = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_b8 = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar7 = L'\0';
  local_b0 = acl;
  if (text == (wchar_t *)0x0) {
    local_c8 = L'\0';
  }
  else {
    local_c8 = L'\0';
    local_c4 = want_type;
    if (*text != L'\0') {
      uVar13 = (ulong)local_b8;
      local_a0 = uVar13 + 0xfffffffe;
      uVar19 = 0;
      local_c8 = L'\0';
      local_c0 = uVar13;
LAB_00403050:
      uVar5 = 0;
      do {
        while ((uVar15 = uVar5, pwVar23 = text, (ulong)(uint)*text < 0x21 &&
               ((0x100000600U >> ((ulong)(uint)*text & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar5 = uVar15;
        }
        while( true ) {
          wVar7 = *pwVar23;
          if (((ulong)(uint)wVar7 < 0x3b) &&
             (pwVar20 = pwVar23, (0x400100000000401U >> ((ulong)(uint)wVar7 & 0x3f) & 1) != 0))
          break;
          pwVar23 = pwVar23 + 1;
        }
        do {
          pwVar21 = pwVar20;
          if (0x20 < (ulong)(uint)pwVar21[-1]) break;
          pwVar20 = pwVar21 + -1;
        } while ((0x100000600U >> ((ulong)(uint)pwVar21[-1] & 0x3f) & 1) != 0);
        wVar1 = *pwVar23;
        if (uVar15 < uVar13) {
          (&local_98)[uVar15 * 2] = text;
          (&local_90)[uVar15 * 2] = (long)pwVar21;
        }
        text = pwVar23 + (wVar1 != L'\0');
        uVar5 = uVar15 + 1;
      } while (wVar7 == L':');
      uVar24 = (uint)uVar15;
      local_a8 = uVar19;
      if ((uint)(uVar15 + 1) < local_b8) {
        memset(local_88 + uVar15 * 2,0,(ulong)((int)local_a0 - uVar24) * 0x10 + 0x10);
      }
      pwVar20 = local_98;
      if ((local_98 != (wchar_t *)0x0) && (*local_98 == L'#')) {
        uVar19 = local_a8 & 0xffffffff;
        uVar13 = local_c0;
        goto LAB_00403a52;
      }
      local_f4 = L'\0';
      if (local_c4 != L'㰀') {
        if ((*local_98 == L'd') &&
           ((uVar13 = local_90 - (long)local_98 >> 2, local_90 - (long)local_98 == 4 ||
            ((6 < uVar13 &&
             (local_d0 = uVar13, iVar6 = wmemcmp(local_98 + 1,anon_var_dwarf_16eac75,6),
             uVar13 = local_d0, iVar6 == 0)))))) {
          uVar22 = 0;
          local_e0 = CONCAT44(local_e0._4_4_,0x200);
          if (uVar13 < 8) {
            uVar22 = 1;
          }
          else {
            local_98 = pwVar20 + 7;
          }
        }
        else {
          uVar22 = 0;
          local_e0 = CONCAT44(local_e0._4_4_,local_c4);
        }
        iVar6 = (int)uVar22;
        local_b4 = iVar6 + 1;
        pwVar20 = *(wchar_t **)((long)&local_98 + (ulong)(local_b4 * 0x10));
        pwVar21 = *(wchar_t **)((long)&local_90 + (ulong)(local_b4 * 0x10));
        if (pwVar20 < pwVar21) {
          pwVar8 = pwVar20;
          wVar7 = L'\0';
          do {
            wVar25 = *pwVar8;
            if ((uint)(wVar25 + L'\xffffffc6') < 0xfffffff6) goto LAB_00403262;
            wVar12 = L'\x7fffffff';
            if ((wVar7 < L'\x0ccccccd') && ((wVar7 != L'\x0ccccccc' || (wVar25 < L'8')))) {
              wVar12 = wVar25 + wVar7 * 10 + L'\xffffffd0';
            }
            pwVar8 = pwVar8 + 1;
            wVar7 = wVar12;
          } while (pwVar8 < pwVar21);
        }
        else {
LAB_00403262:
          wVar12 = L'\xffffffff';
        }
        wVar7 = wVar12;
        if ((wVar12 == L'\xffffffff') && (iVar6 + 3U <= uVar24)) {
          uVar13 = (ulong)((iVar6 + 3U) * 0x10);
          piVar10 = *(int **)((long)&local_98 + uVar13);
          piVar2 = *(int **)((long)&local_90 + uVar13);
          if (piVar10 < piVar2) {
            wVar25 = L'\0';
            do {
              iVar17 = *piVar10;
              wVar7 = wVar12;
              if (iVar17 - 0x3aU < 0xfffffff6) break;
              wVar7 = L'\x7fffffff';
              if ((wVar25 < L'\x0ccccccd') && ((wVar25 != L'\x0ccccccc' || (iVar17 < 0x38)))) {
                wVar7 = iVar17 + wVar25 * 10 + L'\xffffffd0';
              }
              wVar25 = wVar7;
              piVar10 = piVar10 + 1;
              wVar7 = wVar25;
            } while (piVar10 < piVar2);
          }
        }
        piVar10 = *(int **)((long)&local_98 + (ulong)(uint)(iVar6 << 4));
        uVar11 = *piVar10 - 0x67U >> 1 | (uint)((*piVar10 - 0x67U & 1) != 0) << 0x1f;
        iVar16 = 0;
        local_d0 = CONCAT44(local_d0._4_4_,0x2713);
        iVar17 = 0;
        if (uVar11 < 8) {
          lVar9 = *(long *)((long)&local_90 + (ulong)(uint)(iVar6 << 4)) - (long)piVar10;
          pwVar8 = piVar10 + 1;
          iVar17 = 0;
          switch(uVar11) {
          case 0:
            if ((lVar9 == 4) ||
               ((iVar17 = iVar16, lVar9 == 0x14 &&
                (local_f0 = pwVar20, local_e8 = pwVar21, local_d8 = uVar22,
                iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16eacdb + 1,4), pwVar20 = local_f0,
                pwVar21 = local_e8, uVar22 = local_d8, iVar6 == 0)))) {
              iVar17 = 0x2714;
            }
            break;
          case 3:
            if ((lVar9 == 4) ||
               ((iVar17 = iVar16, lVar9 == 0x10 &&
                (local_f0 = pwVar20, local_e8 = pwVar21, local_d8 = uVar22,
                iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16eae15 + 1,3), pwVar20 = local_f0,
                pwVar21 = local_e8, uVar22 = local_d8, iVar6 == 0)))) {
              iVar17 = 0x2715;
            }
            break;
          case 4:
            if ((lVar9 == 4) ||
               ((iVar17 = iVar16, lVar9 == 0x14 &&
                (local_f0 = pwVar20, local_e8 = pwVar21, local_d8 = uVar22,
                iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16eae20 + 1,4), pwVar20 = local_f0,
                pwVar21 = local_e8, uVar22 = local_d8, iVar6 == 0)))) {
              iVar17 = 0x2716;
            }
            break;
          case 7:
            if ((lVar9 == 4) ||
               ((iVar17 = iVar16, lVar9 == 0x10 &&
                (local_f0 = pwVar20, local_e8 = pwVar21, local_d8 = uVar22,
                iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16eacd0 + 1,3), pwVar20 = local_f0,
                pwVar21 = local_e8, uVar22 = local_d8, iVar6 == 0)))) {
              local_d0 = CONCAT44(local_d0._4_4_,0x2711);
              iVar17 = 0x2712;
            }
          }
        }
        if (1 < iVar17 - 0x2715U) {
          if ((iVar17 == 0x2712) || (iVar17 == 0x2714)) {
            iVar6 = 0;
            if ((pwVar21 <= pwVar20) && (wVar7 == L'\xffffffff')) goto LAB_004035e7;
            goto LAB_004035eb;
          }
          goto LAB_004039b6;
        }
        if ((local_b4 == uVar24 && pwVar20 < pwVar21) &&
           (local_f0 = pwVar20, local_e8 = pwVar21, local_d8 = uVar22,
           wVar25 = ismode_w(pwVar20,pwVar21,&local_f4), pwVar20 = local_f0, pwVar21 = local_e8,
           uVar22 = local_d8, wVar25 != L'\0')) {
          iVar6 = -1;
LAB_004035e7:
          pwVar21 = (wchar_t *)0x0;
          pwVar20 = (wchar_t *)0x0;
          local_d0 = CONCAT44(local_d0._4_4_,iVar17);
LAB_004035eb:
          iVar16 = (int)uVar22;
        }
        else {
          iVar16 = (int)uVar22;
          if (iVar16 + 2U != uVar24) {
            iVar6 = 0;
            goto LAB_004035e7;
          }
          if (pwVar20 < pwVar21) goto LAB_004039b6;
          pwVar21 = (wchar_t *)0x0;
          pwVar20 = (wchar_t *)0x0;
          iVar6 = 0;
          local_d0 = CONCAT44(local_d0._4_4_,iVar17);
        }
        wVar25 = (wchar_t)local_e0;
        if (local_f4 == L'\0') {
          uVar13 = (ulong)(iVar6 + iVar16 + 2);
          wVar12 = ismode_w((&local_98)[uVar13 * 2],(wchar_t *)(&local_90)[uVar13 * 2],&local_f4);
          wVar25 = (wchar_t)local_e0;
          if (wVar12 == L'\0') goto LAB_004039b6;
        }
        goto LAB_00403a16;
      }
      bVar4 = 0;
      bVar26 = true;
      switch(local_90 - (long)local_98 >> 2) {
      case 4:
        iVar6 = wmemcmp(local_98,anon_var_dwarf_16eacd0,4);
        bVar4 = 0;
        bVar3 = 0;
        uVar18 = 0;
        if (iVar6 == 0) {
          bVar4 = 1;
          bVar26 = false;
          uVar18 = 0x2711;
          goto LAB_00403653;
        }
        break;
      case 5:
        iVar6 = wmemcmp(local_98,anon_var_dwarf_16eacdb,5);
        bVar4 = 0;
        bVar3 = 0;
        uVar18 = 0;
        if (iVar6 == 0) {
          uVar18 = 0x2713;
          bVar3 = 1;
          bVar26 = false;
          bVar4 = 0;
        }
        break;
      case 6:
        iVar6 = wmemcmp(local_98,anon_var_dwarf_16eacf2,6);
        bVar26 = false;
        if (iVar6 == 0) {
          bVar4 = 0;
          uVar18 = 0x2712;
        }
        else {
          iVar6 = wmemcmp(pwVar20,anon_var_dwarf_16eacfd,6);
          bVar26 = iVar6 != 0;
          uVar18 = 0x2714;
          if (bVar26) {
            uVar18 = 0;
          }
          bVar4 = 0;
        }
        goto LAB_00403653;
      default:
        bVar3 = 0;
        uVar18 = 0;
        break;
      case 9:
        iVar6 = wmemcmp(local_98,anon_var_dwarf_16ead08,9);
        bVar4 = 0;
        bVar26 = iVar6 != 0;
        uVar18 = 0x277b;
        if (bVar26) {
          uVar18 = 0;
        }
LAB_00403653:
        bVar3 = 0;
      }
      uVar19 = 0xffffffec;
      uVar13 = local_c0;
      if (!bVar26) {
        local_d0 = CONCAT44(local_d0._4_4_,uVar18);
        wVar7 = L'\xffffffff';
        wVar12 = wVar7;
        if ((bool)(bVar4 | bVar3)) {
          iVar6 = 1;
          pwVar20 = local_88[0];
          pwVar21 = local_88[1];
          if (local_88[0] < local_88[1]) {
            pwVar8 = local_88[0];
            wVar25 = L'\0';
            do {
              wVar14 = *pwVar8;
              wVar12 = wVar7;
              if ((uint)(wVar14 + L'\xffffffc6') < 0xfffffff6) break;
              wVar12 = L'\x7fffffff';
              if ((wVar25 < L'\x0ccccccd') && ((wVar25 != L'\x0ccccccc' || (wVar14 < L'8')))) {
                wVar12 = wVar14 + wVar25 * 10 + L'\xffffffd0';
              }
              pwVar8 = pwVar8 + 1;
              wVar25 = wVar12;
            } while (pwVar8 < local_88[1]);
          }
        }
        else {
          iVar6 = 0;
          pwVar20 = (wchar_t *)0x0;
          pwVar21 = (wchar_t *)0x0;
        }
        uVar13 = (ulong)(uint)(iVar6 << 4);
        for (piVar10 = *(int **)((long)local_88 + uVar13);
            piVar10 < *(int **)((long)local_88 + uVar13 + 8); piVar10 = piVar10 + 1) {
          iVar6 = *piVar10;
          if (iVar6 < 99) {
            if (iVar6 < 0x44) {
              if (iVar6 != 0x2d) {
                if (iVar6 == 0x41) {
                  local_f4 = local_f4 | 0x400;
                }
                else {
                  if (iVar6 != 0x43) goto switchD_00403739_caseD_71;
                  local_f4 = local_f4 | 0x2000;
                }
              }
            }
            else if (iVar6 < 0x57) {
              if (iVar6 == 0x44) {
                local_f4 = local_f4 | 0x100;
              }
              else {
                if (iVar6 != 0x52) goto switchD_00403739_caseD_71;
                local_f4 = local_f4 | 0x40;
              }
            }
            else if (iVar6 == 0x57) {
              local_f4 = local_f4 | 0x80;
            }
            else {
              if (iVar6 != 0x61) goto switchD_00403739_caseD_71;
              local_f4 = local_f4 | 0x200;
            }
          }
          else {
            switch(iVar6) {
            case 0x6f:
              local_f4 = local_f4 | 0x4000;
              break;
            case 0x70:
              local_f4 = local_f4 | 0x20;
              break;
            case 0x71:
            case 0x74:
            case 0x75:
            case 0x76:
              goto switchD_00403739_caseD_71;
            case 0x72:
              local_f4 = local_f4 | 8;
              break;
            case 0x73:
              local_f4 = local_f4 | 0x8000;
              break;
            case 0x77:
              local_f4 = local_f4 | 0x10;
              break;
            case 0x78:
              local_f4 = local_f4 | 1;
              break;
            default:
              if (iVar6 == 99) {
                local_f4 = local_f4 | 0x1000;
              }
              else {
                if (iVar6 != 100) goto switchD_00403739_caseD_71;
                local_f4 = local_f4 | 0x800;
              }
            }
          }
        }
        for (piVar10 = *(int **)((long)local_88 + uVar13 + 0x10);
            piVar10 < *(int **)((long)local_88 + uVar13 + 0x18); piVar10 = piVar10 + 1) {
          iVar6 = *piVar10;
          if (iVar6 < 100) {
            if (iVar6 < 0x49) {
              if (iVar6 != 0x2d) {
                if (iVar6 != 0x46) goto switchD_00403739_caseD_71;
                local_f4 = local_f4 | 0x40000000;
              }
            }
            else if (iVar6 == 0x49) {
              local_f4 = local_f4 | 0x1000000;
            }
            else {
              if (iVar6 != 0x53) goto switchD_00403739_caseD_71;
              local_f4 = local_f4 | 0x20000000;
            }
          }
          else if (iVar6 < 0x69) {
            if (iVar6 == 100) {
              local_f4 = local_f4 | 0x4000000;
            }
            else {
              if (iVar6 != 0x66) goto switchD_00403739_caseD_71;
              local_f4 = local_f4 | 0x2000000;
            }
          }
          else if (iVar6 == 0x69) {
            local_f4 = local_f4 | 0x10000000;
          }
          else {
            if (iVar6 != 0x6e) goto switchD_00403739_caseD_71;
            local_f4 = local_f4 | 0x8000000;
          }
        }
        pwVar8 = *(wchar_t **)((long)local_88 + uVar13 + 0x20);
        lVar9 = *(long *)((long)alStack_60 + uVar13) - (long)pwVar8;
        local_e0 = uVar13;
        if (lVar9 == 0x14) {
          local_f0 = pwVar20;
          local_e8 = pwVar21;
          iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16ead2a,5);
          if (iVar6 == 0) {
            bVar26 = false;
            wVar25 = L'Ѐ';
            pwVar20 = local_f0;
            pwVar21 = local_e8;
          }
          else {
            iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16ead35,5);
            if (iVar6 == 0) {
              bVar26 = false;
              wVar25 = L'က';
              pwVar20 = local_f0;
              pwVar21 = local_e8;
            }
            else {
              iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16ead40,5);
              bVar26 = iVar6 != 0;
              wVar25 = (uint)(iVar6 == 0) << 0xd;
              pwVar20 = local_f0;
              pwVar21 = local_e8;
            }
          }
        }
        else if (lVar9 == 0x10) {
          iVar6 = wmemcmp(pwVar8,anon_var_dwarf_16ead1f,4);
          bVar26 = iVar6 != 0;
          wVar25 = (uint)(iVar6 == 0) << 0xb;
        }
        else {
          wVar25 = L'\0';
          bVar26 = true;
        }
        if (!bVar26) {
          piVar10 = *(int **)((long)alStack_60 + local_e0 + 8);
          piVar2 = *(int **)((long)alStack_60 + local_e0 + 0x10);
          wVar7 = wVar12;
          if (piVar10 < piVar2) {
            wVar14 = L'\0';
            do {
              iVar6 = *piVar10;
              wVar7 = wVar12;
              if (iVar6 - 0x3aU < 0xfffffff6) break;
              wVar7 = L'\x7fffffff';
              if ((wVar14 < L'\x0ccccccd') && ((wVar14 != L'\x0ccccccc' || (iVar6 < 0x38)))) {
                wVar7 = iVar6 + wVar14 * 10 + L'\xffffffd0';
              }
              piVar10 = piVar10 + 1;
              wVar14 = wVar7;
            } while (piVar10 < piVar2);
          }
LAB_00403a16:
          uVar13 = local_c0;
          wVar7 = archive_acl_add_entry_w_len
                            (local_b0,wVar25,local_f4,(wchar_t)local_d0,wVar7,pwVar20,
                             (long)pwVar21 - (long)pwVar20 >> 2);
          if (wVar7 < L'\xffffffec') {
            return wVar7;
          }
          uVar24 = (uint)local_a8;
          if (wVar7 != L'\0') {
            uVar24 = 0xffffffec;
          }
          local_c8 = local_c8 | wVar25;
          uVar19 = (ulong)uVar24;
          goto LAB_00403a52;
        }
        goto LAB_004039b6;
      }
      goto LAB_00403a52;
    }
  }
LAB_00403a6c:
  archive_acl_reset(local_b0,local_c8);
  return wVar7;
switchD_00403739_caseD_71:
LAB_004039b6:
  uVar19 = 0xffffffec;
  uVar13 = local_c0;
LAB_00403a52:
  wVar7 = (wchar_t)uVar19;
  text = pwVar23 + (wVar1 != L'\0');
  if (*text == L'\0') goto LAB_00403a6c;
  goto LAB_00403050;
}

Assistant:

int
archive_acl_from_text_w(struct archive_acl *acl, const wchar_t *text,
    int want_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[6], name;

	const wchar_t *s, *st;

	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	wchar_t sep;

	ret = ARCHIVE_OK;
	types = 0;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	while (text != NULL && *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == L'#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == L'd' && (len == 1 || (len >= 7
			    && wmemcmp((s + 1), L"efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint_w(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > n+3)
				isint_w(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case L'u':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case L'g':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case L'o':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case L'm':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode_w(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 2
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode_w(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (wmemcmp(s, L"user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (wmemcmp(s, L"group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (wmemcmp(s, L"owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (wmemcmp(s, L"group@", len) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (wmemcmp(s, L"everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint_w(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms_w(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags_w(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (wmemcmp(s, L"deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (wmemcmp(s, L"allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (wmemcmp(s, L"audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (wmemcmp(s, L"alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint_w(field[4 + n].start, field[4 + n].end, &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}